

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

pseudo_t linearize_statement(dmr_C *C,entrypoint *ep,statement *stmt)

{
  allocator *paVar1;
  uint uVar2;
  statement *psVar3;
  statement *stmt_00;
  statement *stmt_01;
  expression *expr;
  position pVar4;
  linearizer_state_t *plVar5;
  expression_list *peVar6;
  symbol *psVar7;
  statement_list *psVar8;
  undefined4 *puVar9;
  pseudo_t ppVar10;
  undefined8 *puVar11;
  pseudo_t ppVar12;
  pseudo_t *pp;
  basic_block *pbVar13;
  basic_block *pbVar14;
  void **ppvVar15;
  symbol *psVar16;
  symbol *psVar17;
  scope *psVar18;
  expression *peVar19;
  undefined8 *puVar20;
  instruction *piVar21;
  basic_block *pbVar22;
  int iVar23;
  symbol *psVar24;
  ptr_list_iter local_b0;
  undefined1 auStack_98 [8];
  ptr_list_iter symiter__;
  basic_block *local_58;
  expression *local_50;
  basic_block *local_48;
  expression *local_40;
  
  if (stmt == (statement *)0x0) {
switchD_0012fd0c_caseD_9:
    return &C->L->void_pseudo;
  }
LAB_0012fc9e:
  pbVar14 = ep->active;
  if ((pbVar14 != (basic_block *)0x0) && (pbVar14->insns == (instruction_list *)0x0)) {
    pbVar14->pos = stmt->pos;
  }
  C->L->current_pos = stmt->pos;
  if (stmt->type == STMT_LABEL) goto code_r0x0012fccc;
  switch(stmt->type) {
  case STMT_DECLARATION:
    ptrlist_concat((ptr_list *)(stmt->field_2).field_1.expression,(ptr_list **)&ep->syms);
    ptrlist_forward_iterator
              ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_1.expression);
    while (psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98),
          psVar17 != (symbol *)0x0) {
      linearize_one_symbol(C,ep,psVar17);
    }
    goto switchD_0012fd0c_caseD_9;
  case STMT_EXPRESSION:
    ppVar10 = linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    return ppVar10;
  case STMT_COMPOUND:
    if ((stmt->field_2).field_3.if_false == (statement *)0x0) {
      ppVar10 = linearize_compound_statement(C,ep,stmt);
      return ppVar10;
    }
    puVar9 = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *puVar9 = 0x34;
    *(position *)(puVar9 + 4) = C->L->current_pos;
    peVar6 = (stmt->field_2).field_10.asm_clobbers;
    if (peVar6 != (expression_list *)0x0) {
      ptrlist_concat((ptr_list *)peVar6->next_,(ptr_list **)&ep->syms);
      ptrlist_forward_iterator((ptr_list_iter *)auStack_98,(ptr_list *)peVar6->next_);
      psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
      if (psVar17 != (symbol *)0x0) {
        do {
          ppVar10 = linearize_one_symbol(C,ep,psVar17);
          ppvVar15 = ptrlist_add((ptr_list **)(puVar9 + 0xc),ppVar10,&C->ptrlist_allocator);
          *ppvVar15 = ppVar10;
          if (((ppVar10 != (pseudo_t)0x0) && (ppVar10->type != PSEUDO_VOID)) &&
             (ppVar10->type != PSEUDO_VAL)) {
            puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
            puVar11[1] = ppvVar15;
            *puVar11 = puVar9;
            ptrlist_add((ptr_list **)&ppVar10->users,puVar11,&C->ptrlist_allocator);
          }
          psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        } while (psVar17 != (symbol *)0x0);
      }
    }
    ppVar10 = linearize_compound_statement(C,ep,stmt);
    *(pseudo_t *)(puVar9 + 8) = ppVar10;
    ppVar12 = symbol_pseudo(C,ep,(stmt->field_2).field_4.inline_fn);
    *(pseudo_t *)(puVar9 + 10) = ppVar12;
    if (((ppVar12 != (pseudo_t)0x0) && (ppVar12->type != PSEUDO_VOID)) &&
       (ppVar12->type != PSEUDO_VAL)) {
      puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar11[1] = puVar9 + 10;
      *puVar11 = puVar9;
      ptrlist_add((ptr_list **)&ppVar12->users,puVar11,&C->ptrlist_allocator);
    }
    pbVar14 = ep->active;
    if (pbVar14 == (basic_block *)0x0) {
      return ppVar10;
    }
    if (pbVar14->insns == (instruction_list *)0x0) {
      pbVar14->pos = stmt->pos;
      pbVar14 = ep->active;
      if (pbVar14 == (basic_block *)0x0) {
        return ppVar10;
      }
    }
    *(basic_block **)(puVar9 + 2) = pbVar14;
    ptrlist_add((ptr_list **)&pbVar14->insns,puVar9,&C->ptrlist_allocator);
    return ppVar10;
  case STMT_IF:
    pVar4 = stmt->pos;
    peVar19 = (stmt->field_2).field_1.expression;
    pbVar14 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
    pbVar14->context = -1;
    pbVar14->pos = pVar4;
    pbVar14->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar14->nr = uVar2;
    pVar4 = stmt->pos;
    pbVar22 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
    pbVar22->context = -1;
    pbVar22->pos = pVar4;
    pbVar22->ep = ep;
    uVar2 = C->L->bb_nr;
    C->L->bb_nr = uVar2 + 1;
    pbVar22->nr = uVar2;
    linearize_cond_branch(C,ep,peVar19,pbVar14,pbVar22);
    set_activeblock(C,ep,pbVar14);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
    pbVar14 = pbVar22;
    if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
      pVar4 = stmt->pos;
      pbVar14 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
      pbVar14->context = -1;
      pbVar14->pos = pVar4;
      pbVar14->ep = ep;
      uVar2 = C->L->bb_nr;
      C->L->bb_nr = uVar2 + 1;
      pbVar14->nr = uVar2;
      add_goto(C,ep,pbVar14);
      set_activeblock(C,ep,pbVar22);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    }
    goto LAB_00130b56;
  case STMT_RETURN:
    peVar19 = (stmt->field_2).field_1.expression;
    pbVar14 = get_bound_block(C,ep,(stmt->field_2).field_2.ret_target);
    ppVar10 = linearize_expression(C,ep,peVar19);
    pbVar22 = ep->active;
    if ((pbVar22 != (basic_block *)0x0) && (ppVar10 != &C->L->void_pseudo)) {
      piVar21 = (instruction *)ptrlist_first((ptr_list *)pbVar14->insns);
      if (piVar21 == (instruction *)0x0) {
        piVar21 = alloc_typed_instruction(C,0x2e,peVar19->ctype);
        ppVar12 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
        ppVar12->type = PSEUDO_REG;
        iVar23 = C->L->nr + 1;
        C->L->nr = iVar23;
        ppVar12->nr = iVar23;
        (ppVar12->field_5).def = piVar21;
        (piVar21->field_5).target = ppVar12;
        piVar21->bb = pbVar14;
        ptrlist_add((ptr_list **)&pbVar14->insns,piVar21,&C->ptrlist_allocator);
      }
      ppVar10 = dmrC_alloc_phi(C,pbVar22,ppVar10,peVar19->ctype);
      ppVar10->ident = C->S->return_ident;
      pp = (pseudo_t *)
           ptrlist_add((ptr_list **)&(piVar21->field_6).field_0,ppVar10,&C->ptrlist_allocator);
      dmrC_use_pseudo(C,piVar21,ppVar10,pp);
    }
    break;
  case STMT_CASE:
    add_label(C,ep,(stmt->field_2).field_6.case_label);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    goto switchD_0012fd0c_caseD_9;
  case STMT_SWITCH:
    pVar4 = stmt->pos;
    pbVar22 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
    pbVar22->context = -1;
    pbVar22->pos = pVar4;
    pbVar22->ep = ep;
    uVar2 = C->L->bb_nr;
    C->L->bb_nr = uVar2 + 1;
    pbVar22->nr = uVar2;
    peVar19 = (stmt->field_2).field_1.expression;
    ppVar10 = linearize_expression(C,ep,peVar19);
    pbVar14 = ep->active;
    if (pbVar14 != (basic_block *)0x0) {
      piVar21 = alloc_typed_instruction(C,5,peVar19->ctype);
      (piVar21->field_5).target = ppVar10;
      if (((ppVar10 != (pseudo_t)0x0) && (ppVar10->type != PSEUDO_VOID)) &&
         (ppVar10->type != PSEUDO_VAL)) {
        puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
        puVar11[1] = &piVar21->field_5;
        *puVar11 = piVar21;
        ptrlist_add((ptr_list **)&ppVar10->users,puVar11,&C->ptrlist_allocator);
      }
      pbVar13 = ep->active;
      if (pbVar13 != (basic_block *)0x0) {
        piVar21->bb = pbVar13;
        ptrlist_add((ptr_list **)&pbVar13->insns,piVar21,&C->ptrlist_allocator);
        if (ep->active != (basic_block *)0x0) {
          ep->active = (basic_block *)0x0;
        }
      }
      ptrlist_forward_iterator
                ((ptr_list_iter *)auStack_98,
                 (ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
      psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
      if (psVar17 == (symbol *)0x0) {
        local_58 = (basic_block *)0x0;
      }
      else {
        paVar1 = &C->ptrlist_allocator;
        local_58 = (basic_block *)0x0;
        do {
          psVar3 = (psVar17->field_14).field_2.stmt;
          pbVar13 = get_bound_block(C,ep,psVar17);
          psVar8 = (psVar3->field_2).field_4.stmts;
          if (psVar8 != (statement_list *)0x0) {
            psVar17 = (symbol *)psVar8->list_[0];
            psVar7 = (psVar3->field_2).field_2.ret_target;
            psVar16 = psVar17;
            psVar24 = psVar17;
            if (psVar7 != (symbol *)0x0) {
              psVar24 = psVar7->next_id;
              psVar16 = psVar24;
              if ((long)psVar17 < (long)psVar24) {
                psVar16 = psVar17;
              }
              if ((long)psVar24 < (long)psVar17) {
                psVar24 = psVar17;
              }
            }
            puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->multijmp_allocator,0);
            *puVar11 = pbVar13;
            puVar11[1] = psVar16;
            puVar11[2] = psVar24;
            ptrlist_add((ptr_list **)&(piVar21->field_6).field_0,puVar11,paVar1);
            ptrlist_add((ptr_list **)&pbVar13->parents,pbVar14,paVar1);
            ptrlist_add((ptr_list **)&pbVar14->children,pbVar13,paVar1);
            pbVar13 = local_58;
          }
          local_58 = pbVar13;
          psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        } while (psVar17 != (symbol *)0x0);
      }
      bind_label(C,(stmt->field_2).field_4.inline_fn,pbVar22,stmt->pos);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
      set_activeblock(C,ep,pbVar22);
      if (local_58 != (basic_block *)0x0) {
        pbVar22 = local_58;
      }
      puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->multijmp_allocator,0);
      *puVar11 = pbVar22;
      puVar11[1] = 1;
      puVar11[2] = 0;
      paVar1 = &C->ptrlist_allocator;
      ptrlist_add((ptr_list **)&(piVar21->field_6).field_0,puVar11,paVar1);
      ptrlist_add((ptr_list **)&pbVar22->parents,pbVar14,paVar1);
      ptrlist_add((ptr_list **)&pbVar14->children,pbVar22,paVar1);
      ptrlist_sort((ptr_list **)&(piVar21->field_6).field_0,C,multijmp_cmp);
    }
    goto switchD_0012fd0c_caseD_9;
  case STMT_ITERATOR:
    psVar3 = (stmt->field_2).field_4.args;
    peVar19 = (stmt->field_2).field_8.iterator_pre_condition;
    stmt_00 = (stmt->field_2).field_8.iterator_statement;
    stmt_01 = (stmt->field_2).field_8.iterator_post_statement;
    expr = (stmt->field_2).field_8.iterator_post_condition;
    ptrlist_forward_iterator
              ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_3.if_false);
    while (psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98),
          psVar17 != (symbol *)0x0) {
      linearize_one_symbol(C,ep,psVar17);
    }
    ptrlist_concat((ptr_list *)(stmt->field_2).field_3.if_false,(ptr_list **)&ep->syms);
    linearize_statement(C,ep,psVar3);
    pVar4 = stmt->pos;
    pbVar22 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
    pbVar22->context = -1;
    pbVar22->pos = pVar4;
    pbVar22->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar22->nr = uVar2;
    pVar4 = stmt->pos;
    pbVar13 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
    pbVar13->context = -1;
    pbVar13->pos = pVar4;
    pbVar13->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar13->nr = uVar2;
    pVar4 = stmt->pos;
    pbVar14 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
    pbVar14->context = -1;
    pbVar14->pos = pVar4;
    pbVar14->ep = ep;
    plVar5 = C->L;
    uVar2 = plVar5->bb_nr;
    plVar5->bb_nr = uVar2 + 1;
    pbVar14->nr = uVar2;
    local_48 = pbVar22;
    if (expr == (expression *)0x0) {
      pVar4 = stmt->pos;
      local_48 = (basic_block *)dmrC_allocator_allocate(&plVar5->basic_block_allocator,0);
      local_48->context = -1;
      local_48->pos = pVar4;
      local_48->ep = ep;
      uVar2 = C->L->bb_nr;
      C->L->bb_nr = uVar2 + 1;
      local_48->nr = uVar2;
      set_activeblock(C,ep,local_48);
    }
    if (peVar19 != (expression *)0x0) {
      linearize_cond_branch(C,ep,peVar19,pbVar22,pbVar14);
    }
    bind_label(C,(stmt->field_2).field_2.ret_target,pbVar13,stmt->pos);
    bind_label(C,(stmt->field_2).field_5.label_identifier,pbVar14,stmt->pos);
    set_activeblock(C,ep,pbVar22);
    linearize_statement(C,ep,stmt_00);
    add_goto(C,ep,pbVar13);
    set_activeblock(C,ep,pbVar13);
    linearize_statement(C,ep,stmt_01);
    if (expr == (expression *)0x0) {
      add_goto(C,ep,local_48);
    }
    else {
      linearize_cond_branch(C,ep,expr,local_48,pbVar14);
    }
LAB_00130b56:
    set_activeblock(C,ep,pbVar14);
    goto switchD_0012fd0c_caseD_9;
  default:
    goto switchD_0012fd0c_caseD_9;
  case STMT_GOTO:
    pbVar14 = ep->active;
    if (pbVar14 == (basic_block *)0x0) goto switchD_0012fd0c_caseD_9;
    psVar17 = (stmt->field_2).field_5.label_identifier;
    if (psVar17 == (symbol *)0x0) {
      peVar19 = (stmt->field_2).field_1.context;
      if (peVar19 == (expression *)0x0) goto switchD_0012fd0c_caseD_9;
      if (*(char *)peVar19 != '\x17') {
        ppVar10 = linearize_expression(C,ep,peVar19);
        piVar21 = (instruction *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
        *(undefined4 *)piVar21 = 7;
        piVar21->pos = C->L->current_pos;
        dmrC_use_pseudo(C,piVar21,ppVar10,&(piVar21->field_5).target);
        pbVar22 = ep->active;
        if (pbVar22 != (basic_block *)0x0) {
          piVar21->bb = pbVar22;
          ptrlist_add((ptr_list **)&pbVar22->insns,piVar21,&C->ptrlist_allocator);
        }
        ptrlist_forward_iterator
                  ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_3.if_false);
        psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        if (psVar17 != (symbol *)0x0) {
          paVar1 = &C->ptrlist_allocator;
          do {
            pbVar22 = get_bound_block(C,ep,psVar17);
            puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->multijmp_allocator,0);
            *puVar11 = pbVar22;
            puVar11[1] = 1;
            puVar11[2] = 0;
            ptrlist_add((ptr_list **)&(piVar21->field_6).field_0,puVar11,paVar1);
            ptrlist_add((ptr_list **)&pbVar22->parents,ep->active,paVar1);
            ptrlist_add((ptr_list **)&pbVar14->children,pbVar22,paVar1);
            psVar17 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
          } while (psVar17 != (symbol *)0x0);
        }
        if (ep->active != (basic_block *)0x0) {
          ep->active = (basic_block *)0x0;
        }
        goto switchD_0012fd0c_caseD_9;
      }
      psVar17 = (peVar19->field_5).field_4.symbol;
    }
    pbVar14 = get_bound_block(C,ep,psVar17);
    break;
  case STMT_ASM:
    psVar17 = (symbol *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *(undefined4 *)psVar17 = 0x3d;
    *(position *)&(psVar17->endpos).field_0x4 = C->L->current_pos;
    psVar8 = (stmt->field_2).field_4.stmts;
    if ((psVar8 == (statement_list *)0x0) || (*(char *)psVar8 != '\x02')) {
      dmrC_warning(C,stmt->pos,"expected string in inline asm");
    }
    else {
      psVar17->replace = (symbol *)&psVar8->list_[1]->pos;
      iVar23 = 0;
      psVar18 = (scope *)dmrC_allocator_allocate(&C->L->asm_rules_allocator,0);
      psVar17->scope = psVar18;
      ptrlist_forward_iterator
                ((ptr_list_iter *)auStack_98,(ptr_list *)(stmt->field_2).field_3.if_false);
      peVar19 = (expression *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
      if (peVar19 != (expression *)0x0) {
        local_50 = (expression *)0x0;
        local_40 = (expression *)0x0;
        do {
          if (iVar23 == 0) {
            iVar23 = 1;
            local_50 = peVar19;
          }
          else if (iVar23 == 2) {
            ppVar10 = linearize_expression(C,ep,peVar19);
            puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->asm_constraint_allocator,0);
            puVar11[2] = local_50;
            puVar11[1] = local_40;
            *puVar11 = ppVar10;
            if (((ppVar10 != (pseudo_t)0x0) && (ppVar10->type != PSEUDO_VOID)) &&
               (ppVar10->type != PSEUDO_VAL)) {
              puVar20 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
              puVar20[1] = puVar11;
              *puVar20 = psVar17;
              ptrlist_add((ptr_list **)&ppVar10->users,puVar20,&C->ptrlist_allocator);
            }
            ptrlist_add((ptr_list **)psVar17->scope,puVar11,&C->ptrlist_allocator);
            iVar23 = 0;
          }
          else {
            local_40 = (expression *)((long)&((peVar19->field_5).field_4.symbol_name)->next + 4);
            iVar23 = 2;
          }
          peVar19 = (expression *)ptrlist_iter_next((ptr_list_iter *)auStack_98);
        } while (peVar19 != (expression *)0x0);
      }
      pbVar14 = ep->active;
      if (pbVar14 != (basic_block *)0x0) {
        *(basic_block **)&(psVar17->pos).field_0x4 = pbVar14;
        ptrlist_add((ptr_list **)&pbVar14->insns,psVar17,&C->ptrlist_allocator);
      }
      ptrlist_forward_iterator(&local_b0,(ptr_list *)(stmt->field_2).field_1.context);
      peVar19 = (expression *)ptrlist_iter_next(&local_b0);
      if (peVar19 != (expression *)0x0) {
        local_40 = (expression *)0x0;
        local_50 = (expression *)0x0;
        iVar23 = 0;
        do {
          if (iVar23 == 0) {
            iVar23 = 1;
            local_40 = peVar19;
          }
          else if (iVar23 == 2) {
            ppVar10 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
            ppVar10->type = PSEUDO_REG;
            iVar23 = C->L->nr + 1;
            C->L->nr = iVar23;
            ppVar10->nr = iVar23;
            (ppVar10->field_5).sym = psVar17;
            auStack_98 = (undefined1  [8])0x0;
            symiter__.__head = (ptr_list *)0x0;
            symiter__.__list = (ptr_list *)0x0;
            symiter__.__nr = 0;
            symiter__._20_4_ = 0;
            iVar23 = linearize_address_gen(C,ep,peVar19,(access_data *)auStack_98);
            if (iVar23 != 0) {
              linearize_store_gen(C,ep,ppVar10,(access_data *)auStack_98);
              puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->asm_constraint_allocator,0);
              puVar11[2] = local_40;
              puVar11[1] = local_50;
              *puVar11 = ppVar10;
              if ((ppVar10->type != PSEUDO_VOID) && (ppVar10->type != PSEUDO_VAL)) {
                puVar20 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
                puVar20[1] = puVar11;
                *puVar20 = psVar17;
                ptrlist_add((ptr_list **)&ppVar10->users,puVar20,&C->ptrlist_allocator);
              }
              ptrlist_add((ptr_list **)&psVar17->scope->symbols,puVar11,&C->ptrlist_allocator);
            }
            iVar23 = 0;
          }
          else {
            local_50 = (expression *)((long)&((peVar19->field_5).field_4.symbol_name)->next + 4);
            iVar23 = 2;
          }
          peVar19 = (expression *)ptrlist_iter_next(&local_b0);
        } while (peVar19 != (expression *)0x0);
      }
    }
    goto switchD_0012fd0c_caseD_9;
  case STMT_CONTEXT:
    iVar23 = 0;
    puVar9 = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *puVar9 = 0x3e;
    *(position *)(puVar9 + 4) = C->L->current_pos;
    peVar19 = (stmt->field_2).field_1.expression;
    if (*(char *)peVar19 == '\x01') {
      iVar23 = (peVar19->field_5).field_2.wide;
    }
    puVar9[10] = iVar23;
    *(expression **)(puVar9 + 0xc) = (stmt->field_2).field_1.context;
    pbVar14 = ep->active;
    if (pbVar14 != (basic_block *)0x0) {
      *(basic_block **)(puVar9 + 2) = pbVar14;
      goto LAB_00130b20;
    }
    goto switchD_0012fd0c_caseD_9;
  case STMT_RANGE:
    puVar9 = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *puVar9 = 0x3f;
    *(position *)(puVar9 + 4) = C->L->current_pos;
    ppVar10 = linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    *(pseudo_t *)(puVar9 + 10) = ppVar10;
    if (((ppVar10 != (pseudo_t)0x0) && (ppVar10->type != PSEUDO_VOID)) &&
       (ppVar10->type != PSEUDO_VAL)) {
      puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar11[1] = puVar9 + 10;
      *puVar11 = puVar9;
      ptrlist_add((ptr_list **)&ppVar10->users,puVar11,&C->ptrlist_allocator);
    }
    ppVar10 = linearize_expression(C,ep,(stmt->field_2).field_1.context);
    *(pseudo_t *)(puVar9 + 0xc) = ppVar10;
    if (((ppVar10 != (pseudo_t)0x0) && (ppVar10->type != PSEUDO_VOID)) &&
       (ppVar10->type != PSEUDO_VAL)) {
      puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar11[1] = puVar9 + 0xc;
      *puVar11 = puVar9;
      ptrlist_add((ptr_list **)&ppVar10->users,puVar11,&C->ptrlist_allocator);
    }
    ppVar10 = linearize_expression(C,ep,(stmt->field_2).field_11.range_high);
    *(pseudo_t *)(puVar9 + 0xe) = ppVar10;
    if (((ppVar10 != (pseudo_t)0x0) && (ppVar10->type != PSEUDO_VOID)) &&
       (ppVar10->type != PSEUDO_VAL)) {
      puVar11 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar11[1] = puVar9 + 0xe;
      *puVar11 = puVar9;
      ptrlist_add((ptr_list **)&ppVar10->users,puVar11,&C->ptrlist_allocator);
    }
    pbVar14 = ep->active;
    if (pbVar14 != (basic_block *)0x0) {
      *(basic_block **)(puVar9 + 2) = pbVar14;
LAB_00130b20:
      ptrlist_add((ptr_list **)&pbVar14->insns,puVar9,&C->ptrlist_allocator);
    }
    goto switchD_0012fd0c_caseD_9;
  }
  add_goto(C,ep,pbVar14);
  goto switchD_0012fd0c_caseD_9;
code_r0x0012fccc:
  psVar17 = (stmt->field_2).field_5.label_identifier;
  if ((psVar17->field_0x2 & 2) != 0) {
    add_label(C,ep,psVar17);
  }
  stmt = (stmt->field_2).field_3.if_true;
  if (stmt == (statement *)0x0) goto switchD_0012fd0c_caseD_9;
  goto LAB_0012fc9e;
}

Assistant:

static pseudo_t linearize_statement(struct dmr_C *C, struct entrypoint *ep, struct statement *stmt)
{
	struct basic_block *bb;

	if (!stmt)
		return VOID_PSEUDO(C);

	bb = ep->active;
	if (bb && !bb->insns)
		bb->pos = stmt->pos;
	C->L->current_pos = stmt->pos;

	switch (stmt->type) {
	case STMT_NONE:
		break;

	case STMT_DECLARATION:
		return linearize_declaration(C, ep, stmt);

	case STMT_CONTEXT:
		return linearize_context(C, ep, stmt);

	case STMT_RANGE:
		return linearize_range(C, ep, stmt);

	case STMT_EXPRESSION:
		return linearize_expression(C, ep, stmt->expression);

	case STMT_ASM:
		return linearize_asm_statement(C, ep, stmt);

	case STMT_RETURN:
		return linearize_return(C, ep, stmt);

	case STMT_CASE: {
		add_label(C, ep, stmt->case_label);
		linearize_statement(C, ep, stmt->case_statement);
		break;
	}

	case STMT_LABEL: {
		struct symbol *label = stmt->label_identifier;

		if (label->used) {
			bb = add_label(C, ep, label);
		}
		return 	linearize_statement(C, ep, stmt->label_statement);
	}

	case STMT_GOTO: {
		struct symbol *sym;
		struct expression *expr;
		struct instruction *goto_ins;
		struct basic_block *active;
		pseudo_t pseudo;

		active = ep->active;
		if (!dmrC_bb_reachable(active))
			break;

		if (stmt->goto_label) {
			add_goto(C, ep, get_bound_block(C, ep, stmt->goto_label));
			break;
		}

		expr = stmt->goto_expression;
		if (!expr)
			break;

		/* This can happen as part of simplification */
		if (expr->type == EXPR_LABEL) {
			add_goto(C, ep, get_bound_block(C, ep, expr->label_symbol));
			break;
		}

		pseudo = linearize_expression(C, ep, expr);
		goto_ins = alloc_instruction(C, OP_COMPUTEDGOTO, 0);
		dmrC_use_pseudo(C, goto_ins, pseudo, &goto_ins->target);
		add_one_insn(C, ep, goto_ins);

		FOR_EACH_PTR(stmt->target_list, sym) {
			struct basic_block *bb_computed = get_bound_block(C, ep, sym);
			struct multijmp *jmp = alloc_multijmp(C, bb_computed, 1, 0);
			dmrC_add_multijmp(C, &goto_ins->multijmp_list, jmp);
			dmrC_add_bb(C, &bb_computed->parents, ep->active);
			dmrC_add_bb(C, &active->children, bb_computed);
		} END_FOR_EACH_PTR(sym);

		finish_block(ep);
		break;
	}

	case STMT_COMPOUND:
		if (stmt->inline_fn)
			return linearize_inlined_call(C, ep, stmt);
		return linearize_compound_statement(C, ep, stmt);

	/*
	 * This could take 'likely/unlikely' into account, and
	 * switch the arms around appropriately..
	 */
	case STMT_IF: {
		struct basic_block *bb_true, *bb_false, *endif;
 		struct expression *cond = stmt->if_conditional;

		bb_true = alloc_basic_block(C, ep, stmt->pos);
		bb_false = endif = alloc_basic_block(C, ep, stmt->pos);

 		linearize_cond_branch(C, ep, cond, bb_true, bb_false);

		set_activeblock(C, ep, bb_true);
 		linearize_statement(C, ep, stmt->if_true);
 
 		if (stmt->if_false) {
			endif = alloc_basic_block(C, ep, stmt->pos);
			add_goto(C, ep, endif);
			set_activeblock(C, ep, bb_false);
 			linearize_statement(C, ep, stmt->if_false);
		}
		set_activeblock(C, ep, endif);
		break;
	}

	case STMT_SWITCH:
		return linearize_switch(C, ep, stmt);

	case STMT_ITERATOR:
		return linearize_iterator(C, ep, stmt);

	default:
		break;
	}
	return VOID_PSEUDO(C);
}